

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode parseurl(char *url,CURLU *u,uint flags)

{
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  CURLUcode CVar7;
  CURLUcode CVar8;
  size_t sVar9;
  byte *pbVar10;
  char *pcVar11;
  Curl_handler *pCVar12;
  uint uVar13;
  byte *__s;
  char *pcVar14;
  byte *pbVar15;
  char *hostname;
  char schemebuf [41];
  byte *local_78;
  char *local_70;
  char local_68 [56];
  
  sVar9 = strlen(url);
  if (8000000 < sVar9) goto LAB_001439d0;
  pbVar10 = (byte *)(*Curl_cmalloc)(sVar9 * 2 + 2);
  u->scratch = (char *)pbVar10;
  if (pbVar10 == (byte *)0x0) {
LAB_00143f48:
    CVar7 = CURLUE_OUT_OF_MEMORY;
  }
  else {
    pbVar15 = pbVar10 + sVar9 + 1;
    pbVar10[sVar9 + 1] = 0;
    local_78 = pbVar15;
    _Var2 = Curl_is_absolute_url(url,local_68,0x29);
    if (_Var2) {
      sVar9 = strlen(local_68);
      iVar4 = Curl_strcasecompare(local_68,"file");
      if (iVar4 == 0) {
        *pbVar10 = 0;
        url = url + sVar9;
        uVar5 = 0xfffffffb;
        do {
          pcVar11 = url + 1;
          url = url + 1;
          uVar13 = uVar5 + 1;
          if (*pcVar11 != '/') break;
          uVar6 = uVar5 + 5;
          uVar5 = uVar13;
        } while (uVar6 < 4);
        if (0xfffffffc < uVar13) {
          pcVar11 = local_68;
          pCVar12 = Curl_builtin_scheme(pcVar11);
          CVar7 = CURLUE_UNSUPPORTED_SCHEME;
          if ((flags & 8) == 0 && pCVar12 == (Curl_handler *)0x0) goto LAB_00143f4d;
          CVar7 = junkscan(pcVar11);
          if (CVar7 == CURLUE_OK) goto LAB_00143ae1;
        }
      }
      else {
        strcpy((char *)pbVar10,url + 5);
        local_78 = (byte *)0x0;
        pcVar11 = (*Curl_cstrdup)("file");
        u->scheme = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_00143f48;
        bVar3 = *pbVar10;
        pbVar15 = pbVar10;
        if (bVar3 == 0x2f) {
          if (pbVar10[1] == 0x2f) {
            pbVar15 = pbVar10 + 2;
            bVar3 = pbVar10[2];
            if (bVar3 != 0x2f) {
              if (((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) ||
                  ((pbVar10[3] != 0x7c && (pbVar10[3] != 0x3a)))) ||
                 ((bVar1 = pbVar10[4], bVar1 != 0 && ((bVar1 != 0x2f && (bVar1 != 0x5c)))))) {
                iVar4 = curl_strnequal("localhost/",(char *)pbVar15,10);
                if ((iVar4 == 0) &&
                   (iVar4 = curl_strnequal("127.0.0.1/",(char *)pbVar15,10), iVar4 == 0))
                goto LAB_001439d0;
                bVar3 = pbVar10[0xb];
                pbVar15 = pbVar10 + 0xb;
                if (bVar3 == 0x2f) goto LAB_00143ca8;
              }
              goto LAB_00143bdc;
            }
          }
LAB_00143ca8:
          pbVar10 = pbVar15;
          if (((byte)((pbVar15[1] & 0xdf) + 0xbf) < 0x1a) &&
             ((pbVar15[2] == 0x7c || (pbVar15[2] == 0x3a)))) {
            bVar3 = pbVar15[3];
LAB_00143cd0:
            if (((bVar3 == 0) || (bVar3 == 0x2f)) || (bVar3 == 0x5c)) goto LAB_001439d0;
          }
        }
        else {
LAB_00143bdc:
          pbVar10 = pbVar15;
          if (((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a) &&
             ((pbVar15[1] == 0x7c || (pbVar15[1] == 0x3a)))) {
            bVar3 = pbVar15[2];
            goto LAB_00143cd0;
          }
        }
LAB_00143db5:
        pCVar12 = Curl_builtin_scheme(u->scheme);
        CVar7 = junkscan((char *)pbVar10);
        if (CVar7 == CURLUE_OK) {
          pcVar11 = strchr((char *)pbVar10,0x3f);
          if (pcVar11 == (char *)0x0) {
            pbVar15 = (byte *)0x0;
          }
          else {
            pbVar15 = (byte *)(pcVar11 + 1);
            *pcVar11 = '\0';
          }
          __s = pbVar15;
          if (pbVar15 == (byte *)0x0) {
            __s = pbVar10;
          }
          pcVar11 = strchr((char *)__s,0x23);
          if (pcVar11 == (char *)0x0) {
            pcVar14 = (char *)0x0;
          }
          else {
            pcVar14 = pcVar11 + 1;
            *pcVar11 = '\0';
          }
          if (*pbVar10 != 0) {
            if ((flags & 0x10) == 0) {
              pcVar11 = Curl_dedotdotify((char *)pbVar10);
              if (pcVar11 == (char *)0x0) goto LAB_00143f48;
              iVar4 = strcmp(pcVar11,(char *)pbVar10);
              if (iVar4 != 0) {
                u->path = pcVar11;
                goto LAB_00143e7d;
              }
              (*Curl_cfree)(pcVar11);
            }
            pcVar11 = (*Curl_cstrdup)((char *)pbVar10);
            u->path = pcVar11;
            if (pcVar11 == (char *)0x0) goto LAB_00143f48;
          }
LAB_00143e7d:
          if (local_78 != (byte *)0x0) {
            CVar8 = junkscan((char *)local_78);
            CVar7 = CURLUE_MALFORMED_INPUT;
            if (((CVar8 != CURLUE_OK) ||
                (CVar7 = parse_hostname_login(u,pCVar12,(char **)&local_78,flags),
                pbVar10 = local_78, CVar7 != CURLUE_OK)) ||
               ((CVar7 = Curl_parse_port(u,(char *)local_78), CVar7 != CURLUE_OK ||
                (CVar7 = hostname_check(u,(char *)pbVar10), CVar7 != CURLUE_OK))))
            goto LAB_00143f4d;
            pcVar11 = (*Curl_cstrdup)((char *)pbVar10);
            u->host = pcVar11;
            if (pcVar11 == (char *)0x0) goto LAB_00143f48;
          }
          if (pbVar15 != (byte *)0x0) {
            pcVar11 = (*Curl_cstrdup)((char *)pbVar15);
            u->query = pcVar11;
            if (pcVar11 == (char *)0x0) goto LAB_00143f48;
          }
          if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
            pcVar11 = (*Curl_cstrdup)(pcVar14);
            u->fragment = pcVar11;
            CVar7 = CURLUE_OUT_OF_MEMORY;
            if (pcVar11 == (char *)0x0) goto LAB_00143f4d;
          }
          (*Curl_cfree)(u->scratch);
          u->scratch = (char *)0x0;
          return CURLUE_OK;
        }
      }
    }
    else {
      *pbVar10 = 0;
      if ((flags & 0x204) != 0) {
        pcVar11 = (char *)0x0;
        if ((flags & 4) != 0) {
          pcVar11 = "https";
        }
LAB_00143ae1:
        sVar9 = 0;
        while ((0x3f < (ulong)(byte)url[sVar9] ||
               ((0x8000800800000001U >> ((ulong)(byte)url[sVar9] & 0x3f) & 1) == 0))) {
          sVar9 = sVar9 + 1;
        }
        if (sVar9 != 0) {
          local_70 = url + sVar9;
          memcpy(pbVar15,url,sVar9);
          pbVar15[sVar9] = 0;
          if (pcVar11 == (char *)0x0 && (flags >> 9 & 1) != 0) {
            iVar4 = curl_strnequal("ftp.",(char *)pbVar15,4);
            if (iVar4 == 0) {
              iVar4 = curl_strnequal("dict.",(char *)pbVar15,5);
              if (iVar4 == 0) {
                iVar4 = curl_strnequal("ldap.",(char *)pbVar15,5);
                if (iVar4 == 0) {
                  iVar4 = curl_strnequal("imap.",(char *)pbVar15,5);
                  if (iVar4 == 0) {
                    iVar4 = curl_strnequal("smtp.",(char *)pbVar15,5);
                    if (iVar4 == 0) {
                      iVar4 = curl_strnequal("pop3.",(char *)pbVar15,5);
                      pcVar11 = "pop3";
                      if (iVar4 == 0) {
                        pcVar11 = "http";
                      }
                    }
                    else {
                      pcVar11 = "smtp";
                    }
                  }
                  else {
                    pcVar11 = "imap";
                  }
                }
                else {
                  pcVar11 = "ldap";
                }
              }
              else {
                pcVar11 = "dict";
              }
            }
            else {
              pcVar11 = "ftp";
            }
          }
          pcVar14 = local_70;
          sVar9 = strlen(local_70);
          memcpy(pbVar10,pcVar14,sVar9);
          pbVar10[sVar9] = 0;
          pcVar11 = (*Curl_cstrdup)(pcVar11);
          u->scheme = pcVar11;
          if (pcVar11 == (char *)0x0) goto LAB_00143f48;
          goto LAB_00143db5;
        }
      }
    }
LAB_001439d0:
    CVar7 = CURLUE_MALFORMED_INPUT;
  }
LAB_00143f4d:
  free_urlhandle(u);
  u->scratch = (char *)0x0;
  u->portnum = 0;
  u->query = (char *)0x0;
  u->fragment = (char *)0x0;
  u->port = (char *)0x0;
  u->path = (char *)0x0;
  u->host = (char *)0x0;
  u->zoneid = (char *)0x0;
  u->password = (char *)0x0;
  u->options = (char *)0x0;
  u->scheme = (char *)0x0;
  u->user = (char *)0x0;
  return CVar7;
}

Assistant:

static CURLUcode parseurl(const char *url, CURLU *u, unsigned int flags)
{
  CURLUcode result = seturl(url, u, flags);
  if(result) {
    free_urlhandle(u);
    memset(u, 0, sizeof(struct Curl_URL));
  }
  return result;
}